

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.h
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::UserEntryLess::operator()
          (UserEntryLess *this,UserEntry *lhs,UserEntry *rhs)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  bool bVar5;
  
  pIVar1 = lhs->def;
  pIVar2 = rhs->def;
  if (pIVar2 != (Instruction *)0x0 && pIVar1 == (Instruction *)0x0) {
    return true;
  }
  if (pIVar1 == (Instruction *)0x0 || pIVar2 != (Instruction *)0x0) {
    if (pIVar1 != (Instruction *)0x0 && pIVar2 != (Instruction *)0x0) {
      uVar3 = Instruction::unique_id(pIVar1);
      uVar4 = Instruction::unique_id(rhs->def);
      if (uVar3 < uVar4) {
        return true;
      }
      uVar3 = Instruction::unique_id(rhs->def);
      uVar4 = Instruction::unique_id(lhs->def);
      if (uVar3 < uVar4) goto LAB_004dcde0;
    }
    pIVar1 = lhs->user;
    bVar5 = rhs->user != (Instruction *)0x0;
    if (bVar5 && pIVar1 != (Instruction *)0x0) {
      uVar3 = Instruction::unique_id(pIVar1);
      uVar4 = Instruction::unique_id(rhs->user);
      bVar5 = uVar3 < uVar4;
    }
    else {
      bVar5 = pIVar1 == (Instruction *)0x0 && bVar5;
    }
  }
  else {
LAB_004dcde0:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator()(const UserEntry& lhs, const UserEntry& rhs) const {
    // If lhs.def and rhs.def are both null, fall through to checking the
    // second entries.
    if (!lhs.def && rhs.def) return true;
    if (lhs.def && !rhs.def) return false;

    // If neither definition is null, then compare unique ids.
    if (lhs.def && rhs.def) {
      if (lhs.def->unique_id() < rhs.def->unique_id()) return true;
      if (rhs.def->unique_id() < lhs.def->unique_id()) return false;
    }

    // Return false on equality.
    if (!lhs.user && !rhs.user) return false;
    if (!lhs.user) return true;
    if (!rhs.user) return false;

    // If neither user is null then compare unique ids.
    return lhs.user->unique_id() < rhs.user->unique_id();
  }